

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O2

int sha3_shake_done(hash_state *md,uchar *out,unsigned_long outlen)

{
  ulong *puVar1;
  ushort uVar2;
  long lVar3;
  unsigned_long uVar4;
  
  if (outlen != 0) {
    if (md == (hash_state *)0x0) {
      fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/Cyan4973[P]smhasher/sha3.c",0x103);
    }
    if (out == (uchar *)0x0) {
      fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/Cyan4973[P]smhasher/sha3.c",0x104);
    }
    if ((md->sha3).xof_flag == 0) {
      *(ulong *)((long)md + (ulong)(md->sha3).word_index * 8 + 8) =
           *(ulong *)((long)md + (ulong)(md->sha3).word_index * 8 + 8) ^ (md->chc).length ^
           0x1fL << ((ulong)(byte)(md->dummy[0x198] << 3) & 0x3f);
      puVar1 = (ulong *)((long)md + (0x18 - (ulong)(md->sha3).capacity_words) * 8 + 8);
      *puVar1 = *puVar1 ^ 0x8000000000000000;
      keccakf((md->whirlpool).state);
      for (lVar3 = -200; lVar3 != 0; lVar3 = lVar3 + 8) {
        *(undefined8 *)((long)md + lVar3 + 0x198) = *(undefined8 *)((long)md + lVar3 + 0xd0);
      }
      (md->sha3).byte_index = 0;
      (md->sha3).xof_flag = 1;
    }
    for (uVar4 = 0; uVar4 != outlen; uVar4 = uVar4 + 1) {
      uVar2 = (md->sha3).byte_index;
      if ((int)((uint)(md->sha3).capacity_words * -8 + 200) <= (int)(uint)uVar2) {
        keccakf((md->whirlpool).state);
        for (lVar3 = -200; lVar3 != 0; lVar3 = lVar3 + 8) {
          *(undefined8 *)((long)md + lVar3 + 0x198) = *(undefined8 *)((long)md + lVar3 + 0xd0);
        }
        uVar2 = 0;
      }
      (md->sha3).byte_index = uVar2 + 1;
      out[uVar4] = md->dummy[(ulong)uVar2 + 0xd0];
    }
  }
  return 0;
}

Assistant:

int sha3_shake_done(hash_state *md, unsigned char *out, unsigned long outlen)
{
   /* IMPORTANT NOTE: sha3_shake_done can be called many times */
   unsigned long idx;
   unsigned i;

   if (outlen == 0) return CRYPT_OK; /* nothing to do */
   LTC_ARGCHK(md  != NULL);
   LTC_ARGCHK(out != NULL);

   if (!md->sha3.xof_flag) {
      /* shake_xof operation must be done only once */
      md->sha3.s[md->sha3.word_index] ^= (md->sha3.saved ^ (CONST64(0x1F) << (md->sha3.byte_index * 8)));
      md->sha3.s[SHA3_KECCAK_SPONGE_WORDS - md->sha3.capacity_words - 1] ^= CONST64(0x8000000000000000);
      keccakf(md->sha3.s);
      /* store sha3.s[] as little-endian bytes into sha3.sb */
      for(i = 0; i < SHA3_KECCAK_SPONGE_WORDS; i++) {
         STORE64L(md->sha3.s[i], md->sha3.sb + i * 8);
      }
      md->sha3.byte_index = 0;
      md->sha3.xof_flag = 1;
   }

   for (idx = 0; idx < outlen; idx++) {
      if(md->sha3.byte_index >= (SHA3_KECCAK_SPONGE_WORDS - md->sha3.capacity_words) * 8) {
         keccakf(md->sha3.s);
         /* store sha3.s[] as little-endian bytes into sha3.sb */
         for(i = 0; i < SHA3_KECCAK_SPONGE_WORDS; i++) {
            STORE64L(md->sha3.s[i], md->sha3.sb + i * 8);
         }
         md->sha3.byte_index = 0;
      }
      out[idx] = md->sha3.sb[md->sha3.byte_index++];
   }
   return CRYPT_OK;
}